

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::sessionFixtureTimeIsOutsideSessionTimeHelper::
sessionFixtureTimeIsOutsideSessionTimeHelper
          (sessionFixtureTimeIsOutsideSessionTimeHelper *this,TestDetails *details)

{
  sessionFixture::sessionFixture(&this->super_sessionFixture);
  (this->super_sessionFixture).super_TestCallback.super_Responder._vptr_Responder =
       (_func_int **)&PTR__sessionFixture_00326990;
  (this->super_sessionFixture).super_TestCallback.super_NullApplication.super_Application.
  _vptr_Application = (_func_int **)&PTR__sessionFixtureTimeIsOutsideSessionTimeHelper_003269e8;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, TimeIsOutsideSessionTime) {
  UtcTimeStamp fixedStartTime = UtcTimeStamp(8, 8, 8, 5, 13, 2019);
  UtcTimeStamp fixedEndTime = UtcTimeStamp(16, 16, 16, 5, 13, 2019);

  startTime = UtcTimeOnly( fixedStartTime );
  endTime = UtcTimeOnly( fixedEndTime );
  createSession(1);

  UtcTimeStamp outsideSessionTime = UtcTimeStamp(20, 20, 20, 5, 13, 2019);

  CHECK(!object->isSessionTime(outsideSessionTime));
}